

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O3

void __thiscall OpenMD::DumpReader::parseSiteLine(DumpReader *this,string *line)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int index;
  StuntDouble *pSVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  RealType RVar9;
  RealType RVar10;
  int siteIndex;
  string type;
  string indexTest;
  StringTokenizer tokenizer;
  istringstream i;
  int local_25c;
  string local_258;
  StuntDouble *local_238;
  RealType local_230;
  string local_228;
  StringTokenizer local_208;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_208,line,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
  }
  iVar3 = StringTokenizer::countTokens(&local_208);
  if (iVar3 < 1) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",
             (line->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  index = StringTokenizer::nextTokenAsInt(&local_208);
  pSVar4 = SimInfo::getIOIndexToIntegrableObject(this->info_,index);
  if (iVar3 == 1 || pSVar4 == (StuntDouble *)0x0) goto LAB_0013a2a9;
  StringTokenizer::peekNextToken_abi_cxx11_(&local_228,&local_208);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_228,_S_in);
  plVar5 = (long *)std::istream::operator>>(local_1b0,&local_25c);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) &&
     (local_25c = StringTokenizer::nextTokenAsInt(&local_208), pSVar4->objType_ == otRigidBody)) {
    if (local_25c <
        (int)((ulong)((long)pSVar4[2].properties_._vptr_PropertyMap - (long)pSVar4[2].mass_) >> 3))
    {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_258,
                 (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar4[2].mass_);
      pSVar4 = *(StuntDouble **)(local_258._M_dataplus._M_p + (long)local_25c * 8);
      operator_delete(local_258._M_dataplus._M_p,
                      local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
      goto LAB_00139f87;
    }
  }
  else {
LAB_00139f87:
    StringTokenizer::nextToken_abi_cxx11_(&local_258,&local_208);
    if (0 < (int)(uint)local_258._M_string_length) {
      uVar8 = 0;
      local_238 = pSVar4;
      do {
        bVar1 = local_258._M_dataplus._M_p[uVar8];
        if (bVar1 < 0x73) {
          switch(bVar1) {
          case 99:
            RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
            if (pSVar4->objType_ < otRigidBody) {
              lVar6 = __dynamic_cast(pSVar4,&StuntDouble::typeinfo,&Atom::typeinfo,0);
              bVar2 = AtomType::isFluctuatingCharge(*(AtomType **)(lVar6 + 0x78));
              if (bVar2) {
                lVar7 = (long)pSVar4->localIndex_;
                lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).flucQPos
                                         .super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_start + pSVar4->storage_
                                 );
                goto LAB_0013a1f4;
              }
            }
            break;
          case 100:
            RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
            lVar7 = (long)pSVar4->localIndex_;
            lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).density.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + pSVar4->storage_);
            goto LAB_0013a1f4;
          case 0x65:
            RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
            local_230 = StringTokenizer::nextTokenAsDouble(&local_208);
            RVar10 = StringTokenizer::nextTokenAsDouble(&local_208);
            if (this->readField_ == true) {
              lVar7 = (long)pSVar4->localIndex_;
              lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).
                                       electricField.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_)
              ;
              *(RealType *)(lVar6 + lVar7 * 0x18) = RVar9;
              *(RealType *)(lVar6 + 8 + lVar7 * 0x18) = local_230;
              *(RealType *)(lVar6 + 0x10 + lVar7 * 0x18) = RVar10;
            }
            break;
          default:
switchD_00139fe0_caseD_66:
            snprintf(painCave.errMsg,2000,"DumpReader Error: %s is an unrecognized type\n");
            pSVar4 = local_238;
            painCave.isFatal = 1;
            simError();
            break;
          case 0x67:
            RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
            if (pSVar4->objType_ < otRigidBody) {
              lVar6 = __dynamic_cast(pSVar4,&StuntDouble::typeinfo,&Atom::typeinfo,0);
              bVar2 = AtomType::isFluctuatingCharge(*(AtomType **)(lVar6 + 0x78));
              if (bVar2) {
                lVar7 = (long)pSVar4->localIndex_;
                lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).flucQFrc
                                         .super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_start + pSVar4->storage_
                                 );
                goto LAB_0013a1f4;
              }
            }
          }
        }
        else {
          if (bVar1 == 0x73) {
            RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
            lVar7 = (long)pSVar4->localIndex_;
            lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).
                                     sitePotential.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + pSVar4->storage_);
          }
          else {
            if (bVar1 != 0x75) {
              if (bVar1 != 0x77) goto switchD_00139fe0_caseD_66;
              RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
              if (pSVar4->objType_ < otRigidBody) {
                lVar6 = __dynamic_cast(pSVar4,&StuntDouble::typeinfo,&Atom::typeinfo,0);
                bVar2 = AtomType::isFluctuatingCharge(*(AtomType **)(lVar6 + 0x78));
                if (bVar2) {
                  lVar7 = (long)pSVar4->localIndex_;
                  lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).
                                           flucQVel.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                   pSVar4->storage_);
                  goto LAB_0013a1f4;
                }
              }
              goto LAB_0013a1f9;
            }
            RVar9 = StringTokenizer::nextTokenAsDouble(&local_208);
            lVar7 = (long)pSVar4->localIndex_;
            lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + pSVar4->storage_);
          }
LAB_0013a1f4:
          *(RealType *)(lVar6 + lVar7 * 8) = RVar9;
        }
LAB_0013a1f9:
        uVar8 = uVar8 + 1;
      } while (((uint)local_258._M_string_length & 0x7fffffff) != uVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
LAB_0013a2a9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.delim_._M_dataplus._M_p != &local_208.delim_.field_2) {
    operator_delete(local_208.delim_._M_dataplus._M_p,
                    local_208.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.tokenString_._M_dataplus._M_p != &local_208.tokenString_.field_2) {
    operator_delete(local_208.tokenString_._M_dataplus._M_p,
                    local_208.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DumpReader::parseSiteLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 1) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    /**
     * The first token is the global integrable object index.
     */

    int index       = tokenizer.nextTokenAsInt();
    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);
    if (sd == NULL) { return; }

    // StuntDoubles have a line even if there is nothing stored in the
    // site data:
    if (nTokens == 1) { return; }

    /**
     * Test to see if the next token is an integer or not.  If not,
     * we've got data on the integrable object itself.  If there is an
     * integer, we're parsing data for a site on a rigid body.
     */
    std::string indexTest = tokenizer.peekNextToken();
    std::istringstream i(indexTest);
    int siteIndex;
    if (i >> siteIndex) {
      // chew up this token and parse as an int:
      siteIndex = tokenizer.nextTokenAsInt();
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);

        // Sometimes site lines are inherited from other models, so
        // just ignore a site line that exceeds the number of atoms in
        // our RB:
        if (siteIndex >= static_cast<int>(rb->getNumAtoms())) { return; }

        sd = rb->getAtoms()[siteIndex];
      }
    }

    /**
     * The next token contains information on what follows.
     */
    std::string type = tokenizer.nextToken();
    int size         = type.size();

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'u': {
        RealType particlePot;
        particlePot = tokenizer.nextTokenAsDouble();
        sd->setParticlePot(particlePot);
        break;
      }
      case 'c': {
        RealType flucQPos;
        flucQPos = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQPos(flucQPos);
        break;
      }
      case 'w': {
        RealType flucQVel;
        flucQVel = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQVel(flucQVel);
        break;
      }
      case 'g': {
        RealType flucQFrc;
        flucQFrc = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQFrc(flucQFrc);
        break;
      }
      case 'e': {
        Vector3d eField;
        eField[0] = tokenizer.nextTokenAsDouble();
        eField[1] = tokenizer.nextTokenAsDouble();
        eField[2] = tokenizer.nextTokenAsDouble();
        if (readField_) sd->setElectricField(eField);
        break;
      }
      case 's': {
        RealType sPot;
        sPot = tokenizer.nextTokenAsDouble();
        sd->setSitePotential(sPot);
        break;
      }
      case 'd': {
        RealType dens;
        dens = tokenizer.nextTokenAsDouble();
        sd->setDensity(dens);
        break;
      }
      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
    }
  }